

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::FixedSizeScanPartial<duckdb::interval_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  pointer pSVar4;
  data_ptr_t pdVar5;
  
  pSVar4 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar1 = state->row_index;
  iVar2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pdVar5 = BufferHandle::Ptr((BufferHandle *)(pSVar4 + 1));
  iVar3 = segment->offset;
  Vector::SetVectorType(result,FLAT_VECTOR);
  switchD_016b0717::default
            (result->data + result_offset * 0x10,pdVar5 + (iVar1 - iVar2) * 0x10 + iVar3,
             scan_count << 4);
  return;
}

Assistant:

void FixedSizeScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                          idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	// copy the data from the base table
	result.SetVectorType(VectorType::FLAT_VECTOR);
	memcpy(FlatVector::GetData(result) + result_offset * sizeof(T), source_data, scan_count * sizeof(T));
}